

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O2

Abc_Cex_t *
Bmc_CexCareSatBasedMinimize
          (Aig_Man_t *p,int nRealPis,Abc_Cex_t *pCex,int fHighEffort,int fCheck,int fVerbose)

{
  Gia_Man_t *p_00;
  Abc_Cex_t *pAVar1;
  
  p_00 = Gia_ManFromAigSimple(p);
  pAVar1 = Bmc_CexCareSatBasedMinimizeAig(p_00,pCex,fHighEffort,fVerbose);
  Gia_ManStop(p_00);
  return pAVar1;
}

Assistant:

Abc_Cex_t * Bmc_CexCareSatBasedMinimize( Aig_Man_t * p, int nRealPis, Abc_Cex_t * pCex, int fHighEffort, int fCheck, int fVerbose )
{
    Gia_Man_t * pGia = Gia_ManFromAigSimple( p );
    Abc_Cex_t * pCexMin = Bmc_CexCareSatBasedMinimizeAig( pGia, pCex, fHighEffort, fVerbose );
    if ( pCexMin == NULL )
    {
        Gia_ManStop( pGia );
        return NULL;
    }
    // unfortunately, cannot verify - ternary simulation does not work
    Gia_ManStop( pGia );
    return pCexMin;
}